

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

int http1_send_body(http_s *h,void *data,uintptr_t length)

{
  FIOBJ dest;
  FIOBJ packet;
  uintptr_t length_local;
  void *data_local;
  http_s *h_local;
  
  dest = headers2str(h,length);
  if (dest == 0) {
    http1_after_finish(h);
    h_local._4_4_ = -1;
  }
  else {
    fiobj_str_write(dest,(char *)data,length);
    fiobj_send_free(*(intptr_t *)((h->private_data).flag + 0x30),dest);
    http1_after_finish(h);
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

static int http1_send_body(http_s *h, void *data, uintptr_t length) {

  FIOBJ packet = headers2str(h, length);
  if (!packet) {
    http1_after_finish(h);
    return -1;
  }
  fiobj_str_write(packet, data, length);
  fiobj_send_free((handle2pr(h)->p.uuid), packet);
  http1_after_finish(h);
  return 0;
}